

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::get_hash_for_compute_pipeline_handle
          (StateRecorder *this,VkPipeline pipeline,Hash *hash)

{
  iterator iVar1;
  VkPipeline_T *local_18;
  
  local_18 = pipeline;
  iVar1 = std::
          _Hashtable<VkPipeline_T_*,_std::pair<VkPipeline_T_*const,_unsigned_long>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkPipeline_T_*>,_std::hash<VkPipeline_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->impl->compute_pipeline_to_hash)._M_h,&local_18);
  if (iVar1.super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>._M_cur
      == (__node_type *)0x0) {
    log_failed_hash<VkPipeline_T*>("Compute pipeline",local_18);
  }
  else {
    *hash = *(Hash *)((long)iVar1.
                            super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>
                            ._M_cur + 0x10);
  }
  return iVar1.super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>.
         _M_cur != (__node_type *)0x0;
}

Assistant:

bool StateRecorder::get_hash_for_compute_pipeline_handle(VkPipeline pipeline, Hash *hash) const
{
	auto itr = impl->compute_pipeline_to_hash.find(pipeline);
	if (itr == end(impl->compute_pipeline_to_hash))
	{
		log_failed_hash("Compute pipeline", pipeline);
		return false;
	}
	else
	{
		*hash = itr->second;
		return true;
	}
}